

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikcp.c
# Opt level: O3

int ikcp_output(ikcpcb *kcp,void *data,int size)

{
  int in_EAX;
  int extraout_EAX;
  int iVar1;
  
  if (kcp == (ikcpcb *)0x0) {
    __assert_fail("kcp",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/3rd/kcp/ikcp.c"
                  ,0xce,"int ikcp_output(ikcpcb *, const void *, int)");
  }
  if (kcp->output != (_func_int_char_ptr_int_IKCPCB_ptr_void_ptr *)0x0) {
    if (((kcp->logmask & 1) != 0) &&
       (kcp->writelog != (_func_void_char_ptr_IKCPCB_ptr_void_ptr *)0x0)) {
      ikcp_log(kcp,1,"[RO] %ld bytes",(long)size);
      in_EAX = extraout_EAX;
    }
    if (size != 0) {
      iVar1 = (*kcp->output)((char *)data,size,kcp,kcp->user);
      return iVar1;
    }
    return in_EAX;
  }
  __assert_fail("kcp->output",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/3rd/kcp/ikcp.c"
                ,0xcf,"int ikcp_output(ikcpcb *, const void *, int)");
}

Assistant:

static int ikcp_output(ikcpcb *kcp, const void *data, int size)
{
	assert(kcp);
	assert(kcp->output);
	if (ikcp_canlog(kcp, IKCP_LOG_OUTPUT)) {
		ikcp_log(kcp, IKCP_LOG_OUTPUT, "[RO] %ld bytes", (long)size);
	}
	if (size == 0) return 0;
	return kcp->output((const char*)data, size, kcp, kcp->user);
}